

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraint.c
# Opt level: O2

void destroy_empty_constraint(Constraint *constraint)

{
  constraint->parameter_name = (char *)0x0;
  constraint->name = (char *)0x0;
  constraint->destroy = (_func_void_Constraint_ptr *)0x0;
  constraint->compare = (_func__Bool_Constraint_ptr_CgreenValue *)0x0;
  constraint->execute =
       (_func_void_Constraint_ptr_char_ptr_CgreenValue_char_ptr_int_TestReporter_ptr *)0x0;
  free(constraint->expected_value_name);
  free(constraint);
  return;
}

Assistant:

void destroy_empty_constraint(Constraint *constraint) {
    constraint->name = NULL;
    constraint->parameter_name = NULL;
    constraint->compare = NULL;
    constraint->execute = NULL;
    constraint->destroy = NULL;

    if (constraint->expected_value_name != NULL)
        free((void *)constraint->expected_value_name);

    free(constraint);
}